

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApi::convertBuffer(RtApi *this,char *outBuffer,char *inBuffer,ConvertInfo *info)

{
  char cVar1;
  byte bVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  pointer piVar7;
  pointer piVar8;
  uint uVar9;
  uint uVar10;
  RtAudioFormat RVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  Float64 *in;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  
  if ((((this->stream_).deviceBuffer == outBuffer) && ((this->stream_).mode == DUPLEX)) &&
     (iVar4 = info->outJump, info->inJump < iVar4)) {
    uVar15 = (this->stream_).bufferSize;
    uVar10 = formatBytes(this,info->outFormat);
    memset(outBuffer,0,(ulong)(iVar4 * uVar15 * uVar10));
  }
  RVar11 = info->outFormat;
  switch(RVar11) {
  case 1:
    RVar11 = info->inFormat;
    if (RVar11 == 1) {
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 == 0) {
        return;
      }
      uVar17 = (ulong)(uint)info->channels;
      uVar10 = 0;
      pcVar13 = inBuffer;
      do {
        if (0 < (int)uVar17) {
          lVar18 = 0;
          do {
            outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18]] =
                 pcVar13[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18]];
            lVar18 = lVar18 + 1;
            uVar17 = (ulong)info->channels;
          } while (lVar18 < (long)uVar17);
          uVar15 = (this->stream_).bufferSize;
        }
        pcVar13 = pcVar13 + info->inJump;
        outBuffer = outBuffer + info->outJump;
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar15);
      RVar11 = info->inFormat;
    }
    if ((long)RVar11 < 8) {
      if (RVar11 == 2) {
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar17 = (ulong)(uint)info->channels;
          uVar10 = 0;
          do {
            if (0 < (int)uVar17) {
              lVar18 = 0;
              do {
                outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18]] =
                     inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar18] * 2 + 1];
                lVar18 = lVar18 + 1;
                uVar17 = (ulong)info->channels;
              } while (lVar18 < (long)uVar17);
              uVar15 = (this->stream_).bufferSize;
            }
            inBuffer = inBuffer + (long)info->inJump * 2;
            outBuffer = outBuffer + info->outJump;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar15);
        }
      }
      else if ((RVar11 == 4) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar18]] =
                   inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar18] * 4 + 2];
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    else if (RVar11 == 8) {
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar18]] =
                   inBuffer[(long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[lVar18] * 4 + 3];
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    else if (RVar11 == 0x10) {
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              lVar12 = llroundf(*(float *)(inBuffer +
                                          (long)(info->inOffset).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[lVar18] * 4
                                          ) * 128.0);
              if (0x7e < lVar12) {
                lVar12 = 0x7f;
              }
              if (lVar12 < -0x7f) {
                lVar12 = -0x80;
              }
              outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar18]] = (char)lVar12;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + info->outJump;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
      uVar17 = (ulong)(uint)info->channels;
      uVar10 = 0;
      do {
        if (0 < (int)uVar17) {
          lVar18 = 0;
          do {
            lVar12 = llround(*(double *)
                              (inBuffer +
                              (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar18] * 8) * 128.0);
            if (0x7e < lVar12) {
              lVar12 = 0x7f;
            }
            if (lVar12 < -0x7f) {
              lVar12 = -0x80;
            }
            outBuffer[(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18]] = (char)lVar12;
            lVar18 = lVar18 + 1;
            uVar17 = (ulong)info->channels;
          } while (lVar18 < (long)uVar17);
          uVar15 = (this->stream_).bufferSize;
        }
        inBuffer = inBuffer + (long)info->inJump * 8;
        outBuffer = outBuffer + info->outJump;
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar15);
    }
    break;
  case 2:
    RVar11 = info->inFormat;
    switch(RVar11) {
    case 1:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar17 = 0;
            do {
              *(ushort *)(outBuffer + (long)piVar8[uVar17] * 2) =
                   (ushort)(byte)inBuffer[piVar7[uVar17]] << 8;
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          inBuffer = inBuffer + iVar4;
          outBuffer = outBuffer + (long)iVar5 * 2;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
      }
      break;
    case 2:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar17 = 0;
            do {
              *(undefined2 *)(outBuffer + (long)piVar8[uVar17] * 2) =
                   *(undefined2 *)(inBuffer + (long)piVar7[uVar17] * 2);
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          inBuffer = inBuffer + (long)iVar4 * 2;
          outBuffer = outBuffer + (long)iVar5 * 2;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar17 = 0;
            do {
              lVar18 = (long)piVar7[uVar17];
              *(short *)(outBuffer + (long)piVar8[uVar17] * 2) =
                   (short)(CONCAT12(inBuffer[lVar18 * 4 + 2],*(undefined2 *)(inBuffer + lVar18 * 4))
                          >> 8);
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 2;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
      }
      break;
    case 8:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar10 = info->channels;
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = info->inJump;
        iVar5 = info->outJump;
        uVar16 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar17 = 0;
            do {
              *(undefined2 *)(outBuffer + (long)piVar8[uVar17] * 2) =
                   *(undefined2 *)(inBuffer + (long)piVar7[uVar17] * 4 + 2);
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          inBuffer = inBuffer + (long)iVar4 * 4;
          outBuffer = outBuffer + (long)iVar5 * 2;
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar15);
      }
      break;
    default:
      if (RVar11 == 0x10) {
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar17 = (ulong)(uint)info->channels;
          uVar10 = 0;
          do {
            if (0 < (int)uVar17) {
              lVar18 = 0;
              do {
                lVar12 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar18] *
                                            4) * 32768.0);
                if (0x7ffe < lVar12) {
                  lVar12 = 0x7fff;
                }
                if (lVar12 < -0x7fff) {
                  lVar12 = -0x8000;
                }
                *(short *)(outBuffer +
                          (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar18] * 2) =
                     (short)lVar12;
                lVar18 = lVar18 + 1;
                uVar17 = (ulong)info->channels;
              } while (lVar18 < (long)uVar17);
              uVar15 = (this->stream_).bufferSize;
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 2;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar15);
        }
      }
      else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              lVar12 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar18] * 8) *
                               32768.0);
              if (0x7ffe < lVar12) {
                lVar12 = 0x7fff;
              }
              if (lVar12 < -0x7fff) {
                lVar12 = -0x8000;
              }
              *(short *)(outBuffer +
                        (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar18] * 2) = (short)lVar12;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 2;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 4:
    RVar11 = info->inFormat;
    switch(RVar11) {
    case 1:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              cVar1 = inBuffer[(info->inOffset).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar18]];
              lVar12 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar18];
              (outBuffer + lVar12 * 4)[0] = '\0';
              (outBuffer + lVar12 * 4)[1] = '\0';
              outBuffer[lVar12 * 4 + 2] = cVar1;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + info->inJump;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 2:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              uVar3 = *(undefined2 *)
                       (inBuffer +
                       (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar18] * 2);
              lVar12 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar18];
              outBuffer[lVar12 * 4] = '\0';
              outBuffer[lVar12 * 4 + 1] = (char)uVar3;
              outBuffer[lVar12 * 4 + 2] = (char)((ushort)uVar3 >> 8);
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 2;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              *(undefined4 *)
               (outBuffer +
               (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18] * 4) =
                   *(undefined4 *)
                    (inBuffer +
                    (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar18] * 4);
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 8:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              uVar6 = *(undefined4 *)
                       (inBuffer +
                       (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar18] * 4);
              lVar12 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar18];
              outBuffer[lVar12 * 4] = (char)((uint)uVar6 >> 8);
              outBuffer[lVar12 * 4 + 1] = (char)((uint)uVar6 >> 0x10);
              outBuffer[lVar12 * 4 + 2] = (char)((uint)uVar6 >> 0x18);
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    default:
      if (RVar11 == 0x10) {
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar17 = (ulong)(uint)info->channels;
          uVar10 = 0;
          do {
            if (0 < (int)uVar17) {
              lVar18 = 0;
              do {
                lVar12 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar18] *
                                            4) * 8388608.0);
                if (0x7ffffe < lVar12) {
                  lVar12 = 0x7fffff;
                }
                if (lVar12 < -0x7fffff) {
                  lVar12 = -0x800000;
                }
                lVar14 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar18];
                outBuffer[lVar14 * 4] = (char)lVar12;
                outBuffer[lVar14 * 4 + 1] = (char)((ulong)lVar12 >> 8);
                outBuffer[lVar14 * 4 + 2] = (char)((ulong)lVar12 >> 0x10);
                lVar18 = lVar18 + 1;
                uVar17 = (ulong)info->channels;
              } while (lVar18 < (long)uVar17);
              uVar15 = (this->stream_).bufferSize;
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 4;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar15);
        }
      }
      else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              lVar12 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar18] * 8) *
                               8388608.0);
              if (0x7ffffe < lVar12) {
                lVar12 = 0x7fffff;
              }
              if (lVar12 < -0x7fffff) {
                lVar12 = -0x800000;
              }
              lVar14 = (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar18];
              outBuffer[lVar14 * 4] = (char)lVar12;
              outBuffer[lVar14 * 4 + 1] = (char)((ulong)lVar12 >> 8);
              outBuffer[lVar14 * 4 + 2] = (char)((ulong)lVar12 >> 0x10);
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    break;
  case 8:
    RVar11 = info->inFormat;
    switch(RVar11) {
    case 1:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              *(int *)(outBuffer + (long)piVar8[lVar18] * 4) = (int)inBuffer[piVar7[lVar18]];
              *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 0x18;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + info->inJump;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 2:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
                   (int)*(short *)(inBuffer + (long)piVar7[lVar18] * 2);
              *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 0x10;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 2;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              lVar12 = (long)piVar7[lVar18];
              bVar2 = inBuffer[lVar12 * 4 + 2];
              uVar15 = ((uint)*(ushort *)(inBuffer + lVar12 * 4) + (uint)bVar2 * 0x10000) -
                       0x1000000;
              if (-1 < (char)bVar2) {
                uVar15 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar12 * 4));
              }
              *(uint *)(outBuffer + (long)piVar8[lVar18] * 4) = uVar15;
              *(int *)(outBuffer + (long)piVar8[lVar18] * 4) =
                   *(int *)(outBuffer + (long)piVar8[lVar18] * 4) << 8;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    case 8:
      uVar15 = (this->stream_).bufferSize;
      if (uVar15 != 0) {
        piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              *(undefined4 *)(outBuffer + (long)piVar8[lVar18] * 4) =
                   *(undefined4 *)(inBuffer + (long)piVar7[lVar18] * 4);
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 4;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
      break;
    default:
      if (RVar11 == 0x10) {
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar17 = (ulong)(uint)info->channels;
          uVar10 = 0;
          do {
            if (0 < (int)uVar17) {
              lVar18 = 0;
              do {
                lVar12 = llroundf(*(float *)(inBuffer +
                                            (long)(info->inOffset).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar18] *
                                            4) * 2.1474836e+09);
                if (0x7ffffffe < lVar12) {
                  lVar12 = 0x7fffffff;
                }
                if (lVar12 < -0x7fffffff) {
                  lVar12 = -0x80000000;
                }
                *(int *)(outBuffer +
                        (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar18] * 4) = (int)lVar12;
                lVar18 = lVar18 + 1;
                uVar17 = (ulong)info->channels;
              } while (lVar18 < (long)uVar17);
              uVar15 = (this->stream_).bufferSize;
            }
            inBuffer = inBuffer + (long)info->inJump * 4;
            outBuffer = outBuffer + (long)info->outJump * 4;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar15);
        }
      }
      else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
        uVar17 = (ulong)(uint)info->channels;
        uVar10 = 0;
        do {
          if (0 < (int)uVar17) {
            lVar18 = 0;
            do {
              lVar12 = llround(*(double *)
                                (inBuffer +
                                (long)(info->inOffset).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar18] * 8) *
                               2147483648.0);
              if (0x7ffffffe < lVar12) {
                lVar12 = 0x7fffffff;
              }
              if (lVar12 < -0x7fffffff) {
                lVar12 = -0x80000000;
              }
              *(int *)(outBuffer +
                      (long)(info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18] * 4) = (int)lVar12;
              lVar18 = lVar18 + 1;
              uVar17 = (ulong)info->channels;
            } while (lVar18 < (long)uVar17);
            uVar15 = (this->stream_).bufferSize;
          }
          inBuffer = inBuffer + (long)info->inJump * 8;
          outBuffer = outBuffer + (long)info->outJump * 4;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar15);
      }
    }
    break;
  default:
    if (RVar11 == 0x10) {
      RVar11 = info->inFormat;
      switch(RVar11) {
      case 1:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar17] * 4) =
                     (float)(int)inBuffer[piVar7[uVar17]] * 0.0078125;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + iVar4;
            outBuffer = outBuffer + (long)iVar5 * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 2:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar17] * 4) =
                     (float)(int)*(short *)(inBuffer + (long)piVar7[uVar17] * 2) * 3.0517578e-05;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 2;
            outBuffer = outBuffer + (long)iVar5 * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                lVar18 = (long)piVar7[uVar17];
                bVar2 = inBuffer[lVar18 * 4 + 2];
                uVar9 = ((uint)*(ushort *)(inBuffer + lVar18 * 4) + (uint)bVar2 * 0x10000) -
                        0x1000000;
                if (-1 < (char)bVar2) {
                  uVar9 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar18 * 4));
                }
                *(float *)(outBuffer + (long)piVar8[uVar17] * 4) = (float)(int)uVar9 * 1.1920929e-07
                ;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 8:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar17] * 4) =
                     (float)*(int *)(inBuffer + (long)piVar7[uVar17] * 4) * 4.656613e-10;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      default:
        if (RVar11 == 0x10) {
          uVar15 = (this->stream_).bufferSize;
          if (uVar15 != 0) {
            uVar10 = info->channels;
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4 = info->inJump;
            iVar5 = info->outJump;
            uVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar17 = 0;
                do {
                  *(undefined4 *)(outBuffer + (long)piVar8[uVar17] * 4) =
                       *(undefined4 *)(inBuffer + (long)piVar7[uVar17] * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar10 != uVar17);
              }
              inBuffer = inBuffer + (long)iVar4 * 4;
              outBuffer = outBuffer + (long)iVar5 * 4;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar15);
          }
        }
        else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(float *)(outBuffer + (long)piVar8[uVar17] * 4) =
                     (float)*(double *)(inBuffer + (long)piVar7[uVar17] * 8);
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 8;
            outBuffer = outBuffer + (long)iVar5 * 4;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
      }
    }
    else if (RVar11 == 0x20) {
      RVar11 = info->inFormat;
      switch(RVar11) {
      case 1:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar17] * 8) =
                     (double)(int)inBuffer[piVar7[uVar17]] * 0.0078125;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + iVar4;
            outBuffer = outBuffer + (long)iVar5 * 8;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 2:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar17] * 8) =
                     (double)(int)*(short *)(inBuffer + (long)piVar7[uVar17] * 2) * 3.0517578125e-05
                ;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 2;
            outBuffer = outBuffer + (long)iVar5 * 8;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        break;
      case 4:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                lVar18 = (long)piVar7[uVar17];
                bVar2 = inBuffer[lVar18 * 4 + 2];
                uVar9 = ((uint)*(ushort *)(inBuffer + lVar18 * 4) + (uint)bVar2 * 0x10000) -
                        0x1000000;
                if (-1 < (char)bVar2) {
                  uVar9 = (uint)CONCAT12(bVar2,*(ushort *)(inBuffer + lVar18 * 4));
                }
                *(double *)(outBuffer + (long)piVar8[uVar17] * 8) =
                     (double)(int)uVar9 * 1.1920928955078125e-07;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 8;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      case 8:
        uVar15 = (this->stream_).bufferSize;
        if (uVar15 != 0) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(double *)(outBuffer + (long)piVar8[uVar17] * 8) =
                     (double)*(int *)(inBuffer + (long)piVar7[uVar17] * 4) * 4.656612873077393e-10;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 4;
            outBuffer = outBuffer + (long)iVar5 * 8;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
        break;
      default:
        if (RVar11 == 0x10) {
          uVar15 = (this->stream_).bufferSize;
          if (uVar15 != 0) {
            uVar10 = info->channels;
            piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar4 = info->inJump;
            iVar5 = info->outJump;
            uVar16 = 0;
            do {
              if (0 < (int)uVar10) {
                uVar17 = 0;
                do {
                  *(double *)(outBuffer + (long)piVar8[uVar17] * 8) =
                       (double)*(float *)(inBuffer + (long)piVar7[uVar17] * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar10 != uVar17);
              }
              inBuffer = inBuffer + (long)iVar4 * 4;
              outBuffer = outBuffer + (long)iVar5 * 8;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar15);
          }
        }
        else if ((RVar11 == 0x20) && (uVar15 = (this->stream_).bufferSize, uVar15 != 0)) {
          uVar10 = info->channels;
          piVar7 = (info->inOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar8 = (info->outOffset).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = info->inJump;
          iVar5 = info->outJump;
          uVar16 = 0;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(undefined8 *)(outBuffer + (long)piVar8[uVar17] * 8) =
                     *(undefined8 *)(inBuffer + (long)piVar7[uVar17] * 8);
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
            inBuffer = inBuffer + (long)iVar4 * 8;
            outBuffer = outBuffer + (long)iVar5 * 8;
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar15);
        }
      }
    }
  }
  return;
}

Assistant:

void RtApi :: convertBuffer( char *outBuffer, char *inBuffer, ConvertInfo &info )
{
  // This function does format conversion, input/output channel compensation, and
  // data interleaving/deinterleaving.  24-bit integers are assumed to occupy
  // the lower three bytes of a 32-bit integer.

  // Clear our duplex device output buffer if there are more device outputs than user outputs
  if ( outBuffer == stream_.deviceBuffer && stream_.mode == DUPLEX && info.outJump > info.inJump )
    memset( outBuffer, 0, stream_.bufferSize * info.outJump * formatBytes( info.outFormat ) );

  int j;
  if (info.outFormat == RTAUDIO_FLOAT64) {
    Float64 *out = (Float64 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 128.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 32768.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]].asInt() / 8388608.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]] / 2147483648.0;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float64) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      // Channel compensation and/or (de)interleaving only.
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_FLOAT32) {
    Float32 *out = (Float32 *)outBuffer;

    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 128.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 32768.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]].asInt() / 8388608.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]] / 2147483648.f;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      // Channel compensation and/or (de)interleaving only.
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Float32) in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT32) {
    Int32 *out = (Int32 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 24;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) in[info.inOffset[j]].asInt();
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      // Channel compensation and/or (de)interleaving only.
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          // Use llround() which returns `long long` which is guaranteed to be at least 64 bits.
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.f), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 2147483648.0), 2147483647LL), -2147483648LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT24) {
    Int24 *out = (Int24 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 16);
          //out[info.outOffset[j]] <<= 16;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] << 8);
          //out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      // Channel compensation and/or (de)interleaving only.
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) (in[info.inOffset[j]] >> 8);
          //out[info.outOffset[j]] >>= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.f), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int32) std::max(std::min(std::llround(in[info.inOffset[j]] * 8388608.0), 8388607LL), -8388608LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT16) {
    Int16 *out = (Int16 *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) in[info.inOffset[j]];
          out[info.outOffset[j]] <<= 8;
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT16) {
      // Channel compensation and/or (de)interleaving only.
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) (in[info.inOffset[j]].asInt() >> 8);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) ((in[info.inOffset[j]] >> 16) & 0x0000ffff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.f), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (Int16) std::max(std::min(std::llround(in[info.inOffset[j]] * 32768.0), 32767LL), -32768LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
  else if (info.outFormat == RTAUDIO_SINT8) {
    signed char *out = (signed char *)outBuffer;
    if (info.inFormat == RTAUDIO_SINT8) {
      // Channel compensation and/or (de)interleaving only.
      signed char *in = (signed char *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = in[info.inOffset[j]];
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    if (info.inFormat == RTAUDIO_SINT16) {
      Int16 *in = (Int16 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 8) & 0x00ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT24) {
      Int24 *in = (Int24 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) (in[info.inOffset[j]].asInt() >> 16);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_SINT32) {
      Int32 *in = (Int32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) ((in[info.inOffset[j]] >> 24) & 0x000000ff);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT32) {
      Float32 *in = (Float32 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.f), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
    else if (info.inFormat == RTAUDIO_FLOAT64) {
      Float64 *in = (Float64 *)inBuffer;
      for (unsigned int i=0; i<stream_.bufferSize; i++) {
        for (j=0; j<info.channels; j++) {
          out[info.outOffset[j]] = (signed char) std::max(std::min(std::llround(in[info.inOffset[j]] * 128.0), 127LL), -128LL);
        }
        in += info.inJump;
        out += info.outJump;
      }
    }
  }
}